

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O2

void __thiscall viface::VIfaceImpl::down(VIfaceImpl *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *this_00;
  string local_200 [32];
  string local_1e0;
  ifreq ifr;
  ostringstream what;
  
  iVar1 = this->kernel_socket;
  std::__cxx11::string::string((string *)&local_1e0,(string *)&this->name);
  read_flags(iVar1,&local_1e0,&ifr);
  std::__cxx11::string::~string((string *)&local_1e0);
  ifr.ifr_ifru.ifru_slave[0] = ifr.ifr_ifru.ifru_slave[0] & 0xfe;
  iVar1 = ioctl(this->kernel_socket,0x8914);
  if (iVar1 == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
  poVar2 = std::operator<<((ostream *)&what,"--- Unable to bring-down interface ");
  std::operator<<(poVar2,(string *)&this->name);
  poVar2 = std::operator<<((ostream *)&what,".");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&what,"    Error: ");
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<((ostream *)&what," (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
  poVar2 = std::operator<<(poVar2,").");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_200);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VIfaceImpl::down() const
{
    // Read interface flags
    struct ifreq ifr;
    read_flags(this->kernel_socket, this->name, ifr);

    // Bring-down interface
    ifr.ifr_flags &= ~IFF_UP;
    if (ioctl(this->kernel_socket, SIOCSIFFLAGS, &ifr) != 0) {
        ostringstream what;
        what << "--- Unable to bring-down interface " << this->name;
        what << "." << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    return;
}